

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SensorManager.cpp
# Opt level: O0

void __thiscall sf::priv::SensorManager::SensorManager(SensorManager *this)

{
  NonCopyable NVar1;
  undefined4 extraout_EDX;
  NonCopyable *in_RDI;
  int i;
  NonCopyable *local_20;
  Type local_18;
  
  NonCopyable::NonCopyable(in_RDI);
  local_20 = in_RDI;
  do {
    Item::Item((Item *)0x25473d);
    local_20 = local_20 + 0x10;
  } while (local_20 != in_RDI + 0x60);
  SensorImpl::initialize();
  for (local_18 = Accelerometer; (int)local_18 < 6; local_18 = local_18 + Gyroscope) {
    NVar1 = (NonCopyable)SensorImpl::isAvailable(local_18);
    in_RDI[(long)(int)local_18 * 0x10] = NVar1;
    if (((byte)in_RDI[(long)(int)local_18 * 0x10] & 1) != 0) {
      SensorImpl::open((SensorImpl *)(in_RDI + (long)(int)local_18 * 0x10 + 2),
                       (char *)(ulong)local_18,CONCAT31((int3)((uint)extraout_EDX >> 8),NVar1));
      SensorImpl::setEnabled((SensorImpl *)(in_RDI + (long)(int)local_18 * 0x10 + 2),false);
    }
  }
  return;
}

Assistant:

SensorManager::SensorManager()
{
    // Global sensor initialization
    SensorImpl::initialize();

    // Per sensor initialization
    for (int i = 0; i < Sensor::Count; ++i)
    {
        // Check which sensors are available
        m_sensors[i].available = SensorImpl::isAvailable(static_cast<Sensor::Type>(i));

        // Open the available sensors
        if (m_sensors[i].available)
        {
            m_sensors[i].sensor.open(static_cast<Sensor::Type>(i));
            m_sensors[i].sensor.setEnabled(false);
        }
    }
}